

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetProperty(cmGeneratorTarget *this,string *prop)

{
  TargetType tgtType;
  bool bVar1;
  cmMessenger *pcVar2;
  char *pcVar3;
  cmListFileBacktrace cStack_48;
  
  tgtType = this->Target->TargetTypeValue;
  pcVar2 = cmMakefile::GetMessenger(this->Makefile);
  GetBacktrace(&cStack_48,this);
  bVar1 = cmTargetPropertyComputer::PassesWhitelist(tgtType,prop,pcVar2,&cStack_48);
  cmListFileBacktrace::~cmListFileBacktrace(&cStack_48);
  if (bVar1) {
    pcVar2 = cmMakefile::GetMessenger(this->Makefile);
    GetBacktrace(&cStack_48,this);
    pcVar3 = cmTargetPropertyComputer::GetProperty<cmGeneratorTarget>(this,prop,pcVar2,&cStack_48);
    cmListFileBacktrace::~cmListFileBacktrace(&cStack_48);
    if (pcVar3 != (char *)0x0) {
      return pcVar3;
    }
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (!bVar1) {
      pcVar3 = cmTarget::GetProperty(this->Target,prop);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cmGeneratorTarget::GetProperty(const std::string& prop) const
{
  if (!cmTargetPropertyComputer::PassesWhitelist(
        this->GetType(), prop, this->Makefile->GetMessenger(),
        this->GetBacktrace())) {
    return CM_NULLPTR;
  }
  if (const char* result = cmTargetPropertyComputer::GetProperty(
        this, prop, this->Makefile->GetMessenger(), this->GetBacktrace())) {
    return result;
  }
  if (cmSystemTools::GetFatalErrorOccured()) {
    return CM_NULLPTR;
  }
  return this->Target->GetProperty(prop);
}